

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O1

void __thiscall Symbol_table::set_value(Symbol_table *this,string *s,double d)

{
  pointer pVVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  runtime_error *prVar4;
  pointer pVVar5;
  bool bVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar5 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pVVar1 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  bVar6 = pVVar5 == pVVar1;
  local_58 = d;
  if (!bVar6) {
    __s2 = (s->_M_dataplus)._M_p;
    sVar2 = s->_M_string_length;
    do {
      __n = (pVVar5->name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp((pVVar5->name)._M_dataplus._M_p,__s2,__n);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
        if (pVVar5->is_const == true) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"value of constant cannot be changed","");
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,(string *)&local_78);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pVVar5->value = local_58;
        if (bVar7) {
          if (!bVar6) {
            return;
          }
          break;
        }
      }
      pVVar5 = pVVar5 + 1;
      bVar6 = pVVar5 == pVVar1;
    } while (!bVar6);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"set: undefined name ","");
  std::operator+(&local_78,&local_50,s);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,(string *)&local_78);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Symbol_table::set_value(const string& s, double d)
{
	for (auto&& var : var_table)
		if (var.name == s)
		{
			if (var.is_const)
				error("value of constant cannot be changed");
			var.value = d;
			return;
		}
	error("set: undefined name ", s);
}